

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxMultiAssign::Emit(FxMultiAssign *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  uint i;
  ulong uVar2;
  undefined4 extraout_var;
  
  (*this->Right->_vptr_FxExpression[9])();
  for (uVar2 = 0; uVar2 < (this->Base).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      uVar2 = uVar2 + 1) {
    FxLocalVariableDeclaration::SetReg
              ((this->LocalVarContainer->LocalVars).Array[uVar2],
               *(ExpEmit *)(this->Right[2].ScriptPosition.FileName.Chars + uVar2 * 8));
  }
  TArray<ExpEmit,_ExpEmit>::Clear((TArray<ExpEmit,_ExpEmit> *)&this->Right[2].ScriptPosition);
  TArray<ExpEmit,_ExpEmit>::ShrinkToFit((TArray<ExpEmit,_ExpEmit> *)&this->Right[2].ScriptPosition);
  EVar1._0_4_ = (*(this->LocalVarContainer->super_FxSequence).super_FxExpression._vptr_FxExpression
                  [9])(this->LocalVarContainer,build);
  EVar1.Konst = (bool)(char)extraout_var;
  EVar1.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar1.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar1.Target = (bool)(char)((uint)extraout_var >> 0x18);
  return EVar1;
}

Assistant:

ExpEmit FxMultiAssign::Emit(VMFunctionBuilder *build)
{
	Right->Emit(build);
	for (unsigned i = 0; i < Base.Size(); i++)
	{
		LocalVarContainer->LocalVars[i]->SetReg(static_cast<FxVMFunctionCall *>(Right)->ReturnRegs[i]);
	}
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.Clear();
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.ShrinkToFit();
	return LocalVarContainer->Emit(build);
}